

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

void sarimax_exec(sarimax_object obj,double *inp,double *xreg)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  double eps;
  int cssml;
  int ncxreg;
  int nd;
  int r;
  int s;
  int Q;
  int D;
  int P;
  int M;
  int N;
  int d;
  int q;
  int p;
  double *xreg_local;
  double *inp_local;
  sarimax_object obj_local;
  
  iVar10 = obj->p;
  iVar2 = obj->q;
  iVar3 = obj->d;
  iVar4 = obj->N;
  iVar5 = obj->P;
  iVar6 = obj->D;
  iVar7 = obj->Q;
  iVar8 = obj->s;
  iVar9 = obj->M;
  if (obj->method == 0) {
    iVar10 = as154x(inp,obj->N,xreg,obj->optmethod,obj->p,obj->d,obj->q,obj->s,obj->P,obj->D,obj->Q,
                    (double *)(obj + 1),(double *)(&obj[1].N + (long)iVar10 * 2),
                    (double *)(&obj[1].N + (long)iVar10 * 2 + (long)iVar2 * 2),
                    (double *)(&obj[1].N + (long)iVar10 * 2 + (long)iVar2 * 2 + (long)iVar5 * 2),
                    (double *)
                    (&obj[1].N +
                    (long)iVar10 * 2 + (long)iVar2 * 2 + (long)iVar5 * 2 + (long)iVar7 * 2),obj->r,
                    &obj->mean,&obj->var,
                    (double *)
                    (&obj[1].N +
                    (long)iVar10 * 2 +
                    (long)iVar2 * 2 + (long)iVar5 * 2 + (long)iVar7 * 2 + (long)iVar9 * 2),
                    &obj->loglik,
                    (double *)
                    ((long)obj +
                    (long)(iVar8 * iVar6) * -8 +
                    (long)iVar3 * -8 +
                    (long)iVar4 * 8 +
                    (long)iVar9 * 8 +
                    (long)iVar7 * 8 + (long)iVar5 * 8 + (long)iVar2 * 8 + (long)iVar10 * 8 + 0xa8),1
                    ,obj->start,obj->imean);
    obj->retval = iVar10;
    iVar10 = obj->Nused;
    dVar1 = obj->loglik;
    dVar11 = log(6.28318);
    obj->loglik = (double)iVar10 * (dVar1 + dVar1 + 1.0 + dVar11) * -0.5;
    obj->aic = ((double)(obj->p + obj->q + obj->P + obj->Q + obj->M) * 2.0 -
               (obj->loglik + obj->loglik)) + 2.0;
  }
  else if (obj->method == 1) {
    iVar10 = as154x(inp,obj->N,xreg,obj->optmethod,obj->p,obj->d,obj->q,obj->s,obj->P,obj->D,obj->Q,
                    (double *)(obj + 1),(double *)(&obj[1].N + (long)iVar10 * 2),
                    (double *)(&obj[1].N + (long)iVar10 * 2 + (long)iVar2 * 2),
                    (double *)(&obj[1].N + (long)iVar10 * 2 + (long)iVar2 * 2 + (long)iVar5 * 2),
                    (double *)
                    (&obj[1].N +
                    (long)iVar10 * 2 + (long)iVar2 * 2 + (long)iVar5 * 2 + (long)iVar7 * 2),obj->r,
                    &obj->mean,&obj->var,
                    (double *)
                    (&obj[1].N +
                    (long)iVar10 * 2 +
                    (long)iVar2 * 2 + (long)iVar5 * 2 + (long)iVar7 * 2 + (long)iVar9 * 2),
                    &obj->loglik,
                    (double *)
                    ((long)obj +
                    (long)(iVar8 * iVar6) * -8 +
                    (long)iVar3 * -8 +
                    (long)iVar4 * 8 +
                    (long)iVar9 * 8 +
                    (long)iVar7 * 8 + (long)iVar5 * 8 + (long)iVar2 * 8 + (long)iVar10 * 8 + 0xa8),0
                    ,obj->start,obj->imean);
    obj->retval = iVar10;
    iVar10 = obj->Nused;
    dVar1 = obj->loglik;
    dVar11 = log(6.28318);
    obj->loglik = (double)iVar10 * (dVar1 + dVar1 + 1.0 + dVar11) * -0.5;
    obj->aic = ((double)(obj->p + obj->q + obj->P + obj->Q + obj->M) * 2.0 -
               (obj->loglik + obj->loglik)) + 2.0;
  }
  else {
    if (obj->method != 2) {
      printf(
            "Only three methods are supported : 0 , 1 and 2 , where 0 is CSS-MLE ,1 is MLE and 2 is CSS \n"
            );
      exit(-1);
    }
    iVar10 = cssx(inp,obj->N,xreg,obj->optmethod,obj->p,obj->d,obj->q,obj->s,obj->P,obj->D,obj->Q,
                  (double *)(obj + 1),(double *)(&obj[1].N + (long)iVar10 * 2),
                  (double *)(&obj[1].N + (long)iVar10 * 2 + (long)iVar2 * 2),
                  (double *)(&obj[1].N + (long)iVar10 * 2 + (long)iVar2 * 2 + (long)iVar5 * 2),
                  (double *)
                  (&obj[1].N +
                  (long)iVar10 * 2 + (long)iVar2 * 2 + (long)iVar5 * 2 + (long)iVar7 * 2),obj->r,
                  &obj->mean,&obj->var,&obj->loglik,
                  (double *)
                  ((long)obj +
                  (long)(iVar8 * iVar6) * -8 +
                  (long)iVar3 * -8 +
                  (long)iVar4 * 8 +
                  (long)iVar9 * 8 +
                  (long)iVar7 * 8 + (long)iVar5 * 8 + (long)iVar2 * 8 + (long)iVar10 * 8 + 0xa8),
                  obj->start,obj->imean);
    obj->retval = iVar10;
    iVar10 = obj->Nused;
    dVar1 = obj->loglik;
    dVar11 = log(6.28318);
    obj->loglik = (double)iVar10 * (dVar1 + dVar1 + 1.0 + dVar11) * -0.5;
  }
  return;
}

Assistant:

void sarimax_exec(sarimax_object obj, double *inp,double *xreg)  {
	int p,q,d,N,M,P,D,Q,s,r,nd,ncxreg,cssml;
	double eps;

	p = obj->p;
	q = obj->q;
	d = obj->d;
	N = obj->N;
	P = obj->P;
	D = obj->D;
	Q = obj->Q;
	s = obj->s;
	r = obj->r;

	M = obj->M;

	if (obj->method == 0) {
		cssml = 1;
		obj->retval = as154x(inp, obj->N, xreg, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q, 
			obj->params + p + q + P,obj->params + p + q + P + Q, obj->r, &obj->mean, &obj->var,obj->params + p + q + P + Q + M,
			 &obj->loglik, obj->params + p + q + P + Q + M + N - d - s*D,cssml,obj->start,obj->imean);
		//mdisplay(obj->vcov,p+q+P+Q+M,p+q+P+Q+M);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * obj->loglik + 2.0 * (obj->p + obj->q + obj->P + obj->Q + obj->M) + 2.0;
	} else if (obj->method == 1) {
		cssml = 0;
		obj->retval = as154x(inp, obj->N, xreg, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q, 
			obj->params + p + q + P,obj->params + p + q + P + Q, obj->r, &obj->mean, &obj->var,obj->params + p + q + P + Q + M,
			 &obj->loglik, obj->params + p + q + P + Q + M + N - d - s*D,cssml,obj->start,obj->imean);
		//mdisplay(obj->vcov,p+q+P+Q+M,p+q+P+Q+M);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
		obj->aic = -2.0 * obj->loglik + 2.0 * (obj->p + obj->q + obj->P + obj->Q + obj->M) + 2.0;
	} else if (obj->method == 2) {
		obj->retval = cssx(inp, obj->N, xreg, obj->optmethod, obj->p, obj->d, obj->q, obj->s, obj->P, obj->D, obj->Q, obj->params, obj->params + p, obj->params + p + q, 
			obj->params + p + q + P,obj->params + p + q + P + Q, obj->r, &obj->mean, &obj->var,&obj->loglik, obj->params + p + q + P + Q + M + N - d - s*D,obj->start,
			obj->imean);
		//mdisplay(obj->vcov,p+q+P+Q+M,p+q+P+Q+M);
		obj->loglik = -0.5 * (obj->Nused * (2 * obj->loglik + 1.0 + log(2 * 3.14159)));
	} else {
		printf("Only three methods are supported : 0 , 1 and 2 , where 0 is CSS-MLE ,1 is MLE and 2 is CSS \n");
		exit(-1);
	}
}